

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int sftp_rmdir(LIBSSH2_SFTP *sftp,char *path,uint path_len)

{
  int iVar1;
  uchar *puVar2;
  ssize_t nwritten;
  uchar *puStack_60;
  int rc;
  uchar *data;
  uchar *s;
  ssize_t packet_len;
  size_t sStack_40;
  uint32_t retcode;
  size_t data_len;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel;
  char *pcStack_20;
  uint path_len_local;
  char *path_local;
  LIBSSH2_SFTP *sftp_local;
  
  session = (LIBSSH2_SESSION *)sftp->channel;
  data_len = (size_t)session->kex_prefs;
  sStack_40 = 0;
  s = (uchar *)(ulong)(path_len + 0xd);
  puStack_60 = (uchar *)0x0;
  channel._4_4_ = path_len;
  pcStack_20 = path;
  path_local = (char *)sftp;
  if (sftp->rmdir_state == libssh2_NB_state_idle) {
    sftp->last_errno = 0;
    data = (uchar *)(*((LIBSSH2_SESSION *)data_len)->alloc)((size_t)s,(void **)data_len);
    *(uchar **)(path_local + 0x140) = data;
    if (*(long *)(path_local + 0x140) == 0) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_len,-6,
                             "Unable to allocate memory for FXP_RMDIR packet");
      return iVar1;
    }
    _libssh2_store_u32(&data,(int)s - 4);
    *data = '\x0f';
    iVar1 = *(int *)(path_local + 8);
    *(int *)(path_local + 8) = iVar1 + 1;
    *(int *)(path_local + 0x148) = iVar1;
    data = data + 1;
    _libssh2_store_u32(&data,*(uint32_t *)(path_local + 0x148));
    _libssh2_store_str(&data,pcStack_20,(ulong)channel._4_4_);
    path_local[0x13c] = '\x02';
    path_local[0x13d] = '\0';
    path_local[0x13e] = '\0';
    path_local[0x13f] = '\0';
  }
  if (*(int *)(path_local + 0x13c) == 2) {
    puVar2 = (uchar *)_libssh2_channel_write
                                ((LIBSSH2_CHANNEL *)session,0,*(uchar **)(path_local + 0x140),
                                 (size_t)s);
    if (puVar2 == (uchar *)0xffffffffffffffdb) {
      return -0x25;
    }
    if (s != puVar2) {
      (**(code **)(data_len + 0x18))(*(undefined8 *)(path_local + 0x140),data_len);
      path_local[0x140] = '\0';
      path_local[0x141] = '\0';
      path_local[0x142] = '\0';
      path_local[0x143] = '\0';
      path_local[0x144] = '\0';
      path_local[0x145] = '\0';
      path_local[0x146] = '\0';
      path_local[0x147] = '\0';
      path_local[0x13c] = '\0';
      path_local[0x13d] = '\0';
      path_local[0x13e] = '\0';
      path_local[0x13f] = '\0';
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_len,-7,"Unable to send FXP_RMDIR command");
      return iVar1;
    }
    (**(code **)(data_len + 0x18))(*(undefined8 *)(path_local + 0x140),data_len);
    path_local[0x140] = '\0';
    path_local[0x141] = '\0';
    path_local[0x142] = '\0';
    path_local[0x143] = '\0';
    path_local[0x144] = '\0';
    path_local[0x145] = '\0';
    path_local[0x146] = '\0';
    path_local[0x147] = '\0';
    path_local[0x13c] = '\x03';
    path_local[0x13d] = '\0';
    path_local[0x13e] = '\0';
    path_local[0x13f] = '\0';
  }
  iVar1 = sftp_packet_require((LIBSSH2_SFTP *)path_local,'e',*(uint32_t *)(path_local + 0x148),
                              &stack0xffffffffffffffa0,&stack0xffffffffffffffc0,9);
  if (iVar1 == -0x25) {
    sftp_local._4_4_ = -0x25;
  }
  else if (iVar1 == -0x26) {
    if (sStack_40 != 0) {
      (**(code **)(data_len + 0x18))(puStack_60,data_len);
    }
    sftp_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"SFTP rmdir packet too short");
  }
  else if (iVar1 == 0) {
    path_local[0x13c] = '\0';
    path_local[0x13d] = '\0';
    path_local[0x13e] = '\0';
    path_local[0x13f] = '\0';
    packet_len._4_4_ = _libssh2_ntohu32(puStack_60 + 5);
    (**(code **)(data_len + 0x18))(puStack_60,data_len);
    if (packet_len._4_4_ == 0) {
      sftp_local._4_4_ = 0;
    }
    else {
      *(uint32_t *)(path_local + 0x48) = packet_len._4_4_;
      sftp_local._4_4_ = _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"SFTP Protocol Error");
    }
  }
  else {
    path_local[0x13c] = '\0';
    path_local[0x13d] = '\0';
    path_local[0x13e] = '\0';
    path_local[0x13f] = '\0';
    sftp_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)data_len,iVar1,"Error waiting for FXP STATUS");
  }
  return sftp_local._4_4_;
}

Assistant:

static int sftp_rmdir(LIBSSH2_SFTP *sftp, const char *path,
                      unsigned int path_len)
{
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t data_len = 0;
    uint32_t retcode;
    /* 13 = packet_len(4) + packet_type(1) + request_id(4) + path_len(4) */
    ssize_t packet_len = path_len + 13;
    unsigned char *s, *data = NULL;
    int rc;

    if(sftp->rmdir_state == libssh2_NB_state_idle) {
        sftp->last_errno = LIBSSH2_FX_OK;

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP, "Removing directory: %s",
                       path));
        s = sftp->rmdir_packet = LIBSSH2_ALLOC(session, packet_len);
        if(!sftp->rmdir_packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for FXP_RMDIR "
                                  "packet");
        }

        _libssh2_store_u32(&s, (uint32_t)(packet_len - 4));
        *(s++) = SSH_FXP_RMDIR;
        sftp->rmdir_request_id = sftp->request_id++;
        _libssh2_store_u32(&s, sftp->rmdir_request_id);
        _libssh2_store_str(&s, path, path_len);

        sftp->rmdir_state = libssh2_NB_state_created;
    }

    if(sftp->rmdir_state == libssh2_NB_state_created) {
        ssize_t nwritten;
        nwritten = _libssh2_channel_write(channel, 0, sftp->rmdir_packet,
                                          packet_len);
        if(nwritten == LIBSSH2_ERROR_EAGAIN) {
            return (int)nwritten;
        }
        else if(packet_len != nwritten) {
            LIBSSH2_FREE(session, sftp->rmdir_packet);
            sftp->rmdir_packet = NULL;
            sftp->rmdir_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "Unable to send FXP_RMDIR command");
        }
        LIBSSH2_FREE(session, sftp->rmdir_packet);
        sftp->rmdir_packet = NULL;

        sftp->rmdir_state = libssh2_NB_state_sent;
    }

    rc = sftp_packet_require(sftp, SSH_FXP_STATUS,
                             sftp->rmdir_request_id, &data, &data_len, 9);
    if(rc == LIBSSH2_ERROR_EAGAIN) {
        return rc;
    }
    else if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
        if(data_len > 0) {
            LIBSSH2_FREE(session, data);
        }
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP rmdir packet too short");
    }
    else if(rc) {
        sftp->rmdir_state = libssh2_NB_state_idle;
        return _libssh2_error(session, rc,
                              "Error waiting for FXP STATUS");
    }

    sftp->rmdir_state = libssh2_NB_state_idle;

    retcode = _libssh2_ntohu32(data + 5);
    LIBSSH2_FREE(session, data);

    if(retcode == LIBSSH2_FX_OK) {
        return 0;
    }
    else {
        sftp->last_errno = retcode;
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP Protocol Error");
    }
}